

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  ImDrawList *this;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  undefined8 uVar18;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [256];
  undefined1 local_38 [8];
  
  iVar2 = tab_bar->PrevFrameVisible;
  iVar10 = GImGui->FrameCount + -2;
  pcVar13 = " *Inactive*";
  if (iVar10 <= iVar2) {
    pcVar13 = "";
  }
  iVar11 = ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                          (ulong)(uint)(tab_bar->Tabs).Size,pcVar13);
  iVar12 = ImFormatString(local_138 + iVar11,0x100 - (long)iVar11,"  { ");
  pcVar13 = local_138 + iVar11 + iVar12;
  if ((tab_bar->Tabs).Size < 1) {
    pcVar15 = " } ";
  }
  else {
    lVar17 = 0;
    lVar14 = 0;
    do {
      pIVar4 = (tab_bar->Tabs).Data;
      pcVar15 = ", ";
      if (lVar17 == 0) {
        pcVar15 = "";
      }
      if ((*(long *)((long)&pIVar4->Window + lVar17) != 0) ||
         (*(int *)((long)&pIVar4->NameOffset + lVar17) != -1)) {
        ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)((long)&pIVar4->ID + lVar17));
      }
      iVar11 = ImFormatString(pcVar13,(size_t)(local_38 + -(long)pcVar13),"%s\'%s\'",pcVar15);
      pcVar13 = pcVar13 + iVar11;
      lVar14 = lVar14 + 1;
      iVar11 = (tab_bar->Tabs).Size;
      iVar12 = 3;
      if (iVar11 < 3) {
        iVar12 = iVar11;
      }
      lVar17 = lVar17 + 0x30;
    } while (lVar14 < iVar12);
    pcVar15 = " } ";
    if (3 < iVar11) {
      pcVar15 = " ... }";
    }
  }
  ImFormatString(pcVar13,(size_t)(local_38 + -(long)pcVar13),pcVar15);
  if (iVar2 < iVar10) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar8 = TreeNode(label,"%s",local_138);
    PopStyleColor(1);
  }
  else {
    bVar8 = TreeNode(label,"%s",local_138);
    bVar9 = IsItemHovered(0);
    if (bVar9) {
      this = GetViewportDrawList(GImGui->CurrentWindow->Viewport,1,"##Foreground");
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar8 != false) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        pIVar5 = (tab_bar->Tabs).Data;
        pIVar4 = (ImGuiTabItem *)((long)&pIVar5->ID + lVar14);
        PushID(pIVar4);
        bVar8 = SmallButton("<");
        if (bVar8) {
          TabBarQueueReorder(tab_bar,pIVar4,-1);
        }
        pIVar6 = GImGui->CurrentWindow;
        pIVar6->WriteAccessed = true;
        if (pIVar6->SkipItems == false) {
          fVar1 = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CursorPos.x = (pIVar6->DC).CursorPosPrevLine.x + 2.0;
          (pIVar6->DC).CursorPos.y = fVar1;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
        }
        bVar8 = SmallButton(">");
        if (bVar8) {
          TabBarQueueReorder(tab_bar,pIVar4,1);
        }
        pIVar7 = GImGui;
        pIVar6 = GImGui->CurrentWindow;
        pIVar6->WriteAccessed = true;
        if (pIVar6->SkipItems == false) {
          (pIVar6->DC).CursorPos.x =
               (pIVar7->Style).ItemSpacing.x + (pIVar6->DC).CursorPosPrevLine.x;
          (pIVar6->DC).CursorPos.y = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
        }
        uVar3 = *(uint *)((long)&pIVar5->ID + lVar14);
        uVar18 = 0x2a;
        if (uVar3 != tab_bar->SelectedTabId) {
          uVar18 = 0x20;
        }
        if ((*(long *)((long)&pIVar5->Window + lVar14) != 0) ||
           (pcVar13 = "???", *(int *)((long)&pIVar5->NameOffset + lVar14) != -1)) {
          pcVar13 = ImGuiTabBar::GetTabName(tab_bar,pIVar4);
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             (double)*(float *)((long)&pIVar5->Offset + lVar14),
             (double)*(float *)((long)&pIVar5->Width + lVar14),
             (double)*(float *)((long)&pIVar5->ContentWidth + lVar14),uVar16 & 0xffffffff,uVar18,
             (ulong)uVar3,pcVar13);
        PopID();
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x30;
      } while ((long)uVar16 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}